

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::ModifyRepeatedFields<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  pointer piVar1;
  pointer plVar2;
  pointer puVar3;
  pointer puVar4;
  pointer pfVar5;
  pointer pdVar6;
  pointer pbVar7;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar8;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar9;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar10;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar11;
  Reflection *pRVar12;
  Descriptor *pDVar13;
  FieldDescriptor *pFVar14;
  string_view name;
  string_view name_00;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.repeated_int32_,1);
  *piVar1 = 0x1f5;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.repeated_int64_,1);
  *plVar2 = 0x1f6;
  puVar3 = RepeatedField<unsigned_int>::Mutable(&(message->field_0)._impl_.repeated_uint32_,1);
  *puVar3 = 0x1f7;
  puVar4 = RepeatedField<unsigned_long>::Mutable(&(message->field_0)._impl_.repeated_uint64_,1);
  *puVar4 = 0x1f8;
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.repeated_sint32_,1);
  *piVar1 = 0x1f9;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.repeated_sint64_,1);
  *plVar2 = 0x1fa;
  puVar3 = RepeatedField<unsigned_int>::Mutable(&(message->field_0)._impl_.repeated_fixed32_,1);
  *puVar3 = 0x1fb;
  puVar4 = RepeatedField<unsigned_long>::Mutable(&(message->field_0)._impl_.repeated_fixed64_,1);
  *puVar4 = 0x1fc;
  piVar1 = RepeatedField<int>::Mutable(&(message->field_0)._impl_.repeated_sfixed32_,1);
  *piVar1 = 0x1fd;
  plVar2 = RepeatedField<long>::Mutable(&(message->field_0)._impl_.repeated_sfixed64_,1);
  *plVar2 = 0x1fe;
  pfVar5 = RepeatedField<float>::Mutable(&(message->field_0)._impl_.repeated_float_,1);
  *pfVar5 = 511.0;
  pdVar6 = RepeatedField<double>::Mutable(&(message->field_0)._impl_.repeated_double_,1);
  *pdVar6 = 512.0;
  pbVar7 = RepeatedField<bool>::Mutable(&(message->field_0)._impl_.repeated_bool_,1);
  *pbVar7 = true;
  proto2_unittest::TestAllTypes::set_repeated_string<char_const(&)[4]>
            (message,1,(char (*) [4])"515");
  proto2_unittest::TestAllTypes::set_repeated_bytes<char_const(&)[4]>(message,1,(char (*) [4])"516")
  ;
  pVVar8 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase,1);
  (pVVar8->field_0)._impl_.a_ = 0x205;
  *(byte *)&pVVar8->field_0 = *(byte *)&pVVar8->field_0 | 1;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                      ,1);
  (pVVar9->field_0)._impl_.bb_ = 0x206;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 1;
  pVVar10 = internal::RepeatedPtrFieldBase::
            Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                      (&(message->field_0)._impl_.repeated_foreign_message_.
                        super_RepeatedPtrFieldBase,1);
  (pVVar10->field_0)._impl_.c_ = 0x207;
  *(byte *)&pVVar10->field_0 = *(byte *)&pVVar10->field_0 | 1;
  pVVar11 = internal::RepeatedPtrFieldBase::
            Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                      (&(message->field_0)._impl_.repeated_import_message_.
                        super_RepeatedPtrFieldBase,1);
  (pVVar11->field_0)._impl_.d_ = 0x208;
  *(byte *)&pVVar11->field_0 = *(byte *)&pVVar11->field_0 | 1;
  pVVar9 = internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase,1
                     );
  (pVVar9->field_0)._impl_.bb_ = 0x20f;
  *(byte *)&pVVar9->field_0 = *(byte *)&pVVar9->field_0 | 1;
  proto2_unittest::TestAllTypes::set_repeated_nested_enum(message,1,TestAllTypes_NestedEnum_FOO);
  proto2_unittest::TestAllTypes::set_repeated_foreign_enum(message,1,FOREIGN_FOO);
  proto2_unittest::TestAllTypes::set_repeated_import_enum(message,1,IMPORT_FOO);
  pRVar12 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar13 = proto2_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "repeated_string_piece";
  name._M_len = 0x15;
  pFVar14 = Descriptor::FindFieldByName(pDVar13,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"524",&local_61);
  Reflection::SetRepeatedString(pRVar12,&message->super_Message,pFVar14,1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pRVar12 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar13 = proto2_unittest::TestAllTypes::GetDescriptor();
  name_00._M_str = "repeated_cord";
  name_00._M_len = 0xd;
  pFVar14 = Descriptor::FindFieldByName(pDVar13,name_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"525",&local_61);
  Reflection::SetRepeatedString(pRVar12,&message->super_Message,pFVar14,1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void ModifyRepeatedFields(TestAllTypes* message) {
  message->set_repeated_int32(1, 501);
  message->set_repeated_int64(1, 502);
  message->set_repeated_uint32(1, 503);
  message->set_repeated_uint64(1, 504);
  message->set_repeated_sint32(1, 505);
  message->set_repeated_sint64(1, 506);
  message->set_repeated_fixed32(1, 507);
  message->set_repeated_fixed64(1, 508);
  message->set_repeated_sfixed32(1, 509);
  message->set_repeated_sfixed64(1, 510);
  message->set_repeated_float(1, 511);
  message->set_repeated_double(1, 512);
  message->set_repeated_bool(1, true);
  message->set_repeated_string(1, "515");
  message->set_repeated_bytes(1, "516");

  message->mutable_repeatedgroup(1)->set_a(517);
  message->mutable_repeated_nested_message(1)->set_bb(518);
  message->mutable_repeated_foreign_message(1)->set_c(519);
  message->mutable_repeated_import_message(1)->set_d(520);
  message->mutable_repeated_lazy_message(1)->set_bb(527);

  message->set_repeated_nested_enum(1, TestAllTypes::FOO);
  message->set_repeated_foreign_enum(1, ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_repeated_import_enum(1, ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetRepeatedString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"), 1,
      "524");
  message->GetReflection()->SetRepeatedString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"), 1,
      "525");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}